

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int fftkey(char *keyword,int *status)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  size_t sVar6;
  __int32_t **pp_Var7;
  size_t sVar8;
  char *err_message;
  char msg [81];
  
  err_message = msg;
  iVar2 = *status;
  if (iVar2 < 1) {
    sVar6 = strlen(keyword);
    sVar8 = 8;
    if (sVar6 < 8) {
      sVar8 = sVar6;
    }
    bVar3 = false;
    for (sVar6 = 0; sVar8 != sVar6; sVar6 = sVar6 + 1) {
      if (iVar2 == 0) {
        cVar1 = keyword[sVar6];
        cVar5 = cVar1;
      }
      else {
        pp_Var7 = __ctype_toupper_loc();
        cVar1 = (char)(*pp_Var7)[keyword[sVar6]];
        cVar5 = keyword[sVar6];
      }
      if ((((byte)(cVar1 - 0x30U) < 10 || (byte)(cVar1 + 0xbfU) < 0x1a) || (cVar1 == '_')) ||
         (cVar1 == '-')) {
        bVar4 = false;
        if (bVar3) {
          if (iVar2 != 0) goto LAB_001345ba;
          snprintf(msg,0x51,"Keyword name contains embedded space(s): %.8s",keyword);
          goto LAB_001345b2;
        }
      }
      else {
        bVar4 = true;
        if (cVar5 != ' ') {
          if (iVar2 != 0) goto LAB_001345ba;
          snprintf(msg,0x51,"Character %d in this keyword is illegal: %.8s",(ulong)((int)sVar6 + 1),
                   keyword);
          ffpmsg(msg);
          if (keyword[sVar6] == '\0') {
            err_message = " (This a NULL (0) character).";
          }
          else {
            if (keyword[sVar6] != '\t') goto LAB_001345ba;
            err_message = " (This an ASCII TAB (9) character).";
          }
LAB_001345b2:
          ffpmsg(err_message);
LAB_001345ba:
          *status = 0xcf;
          return 0xcf;
        }
      }
      bVar3 = bVar4;
    }
  }
  return iVar2;
}

Assistant:

int fftkey(const char *keyword,    /* I -  keyword name */
           int *status)      /* IO - error status */
/*
  Test that the keyword name conforms to the FITS standard.  Must contain
  only capital letters, digits, minus or underscore chars.  Trailing spaces
  are allowed.  If the input status value is less than zero, then the test
  is modified so that upper or lower case letters are allowed, and no 
  error messages are printed if the keyword is not legal.
*/
{
    size_t maxchr, ii;
    int spaces=0;
    char msg[FLEN_ERRMSG], testchar;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    maxchr=strlen(keyword);
    if (maxchr > 8)
        maxchr = 8;

    for (ii = 0; ii < maxchr; ii++)
    {
        if (*status == 0)
            testchar = keyword[ii];
        else
            testchar = toupper(keyword[ii]);

        if ( (testchar >= 'A' && testchar <= 'Z') ||
             (testchar >= '0' && testchar <= '9') ||
              testchar == '-' || testchar == '_'   )
              {
                if (spaces)
                {
                  if (*status == 0)
                  {
                     /* don't print error message if status < 0  */
                    snprintf(msg, FLEN_ERRMSG,
                       "Keyword name contains embedded space(s): %.8s",
                        keyword);
                     ffpmsg(msg);
                  }
                  return(*status = BAD_KEYCHAR);        
                }
              }
        else if (keyword[ii] == ' ')
            spaces = 1;

        else     
        {
          if (*status == 0)
          {
            /* don't print error message if status < 0  */
            snprintf(msg, FLEN_ERRMSG,"Character %d in this keyword is illegal: %.8s",
                    (int) (ii+1), keyword);
            ffpmsg(msg);

            /* explicitly flag the 2 most common cases */
            if (keyword[ii] == 0) 
                ffpmsg(" (This a NULL (0) character).");                
            else if (keyword[ii] == 9)
                ffpmsg(" (This an ASCII TAB (9) character).");   
          }             

          return(*status = BAD_KEYCHAR);        
        }                
    }
    return(*status);        
}